

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ImGui::ShowStyleEditor(ImGuiStyle *ref)

{
  float fVar1;
  ImVec4 IVar2;
  ImFontAtlas *pIVar3;
  ImFont *font_00;
  ImTextureID user_texture_id;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  ImVec2 IVar9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [11];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  ImVec2 pos;
  short sVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  ImU32 IVar22;
  size_t sVar23;
  ImVec4 *pIVar24;
  ImGuiIO *pIVar25;
  ImFont **ppIVar26;
  ImFontConfig *pIVar27;
  ImFontGlyph *pIVar28;
  ImDrawList *this;
  ImVec4 *pIVar29;
  char *pcVar30;
  undefined1 extraout_XMM0_Ba;
  undefined1 extraout_XMM0_Ba_00;
  undefined1 extraout_XMM0_Ba_01;
  undefined1 extraout_XMM0_Ba_02;
  undefined1 extraout_XMM0_Ba_03;
  undefined1 extraout_XMM0_Ba_04;
  undefined1 extraout_XMM0_Ba_05;
  undefined1 uVar31;
  undefined1 extraout_XMM0_Ba_06;
  undefined1 extraout_XMM0_Ba_07;
  undefined1 extraout_XMM0_Ba_08;
  undefined1 extraout_XMM0_Ba_09;
  undefined1 extraout_XMM0_Ba_10;
  undefined1 extraout_XMM0_Ba_11;
  undefined1 extraout_XMM0_Ba_12;
  undefined1 extraout_XMM0_Ba_13;
  undefined1 extraout_XMM0_Ba_14;
  undefined1 extraout_XMM0_Ba_15;
  undefined1 extraout_XMM0_Ba_16;
  undefined1 extraout_XMM0_Ba_17;
  undefined1 extraout_XMM0_Ba_18;
  undefined1 extraout_XMM0_Ba_19;
  undefined1 extraout_XMM0_Ba_20;
  undefined1 extraout_XMM0_Ba_21;
  undefined1 extraout_XMM0_Ba_22;
  undefined1 extraout_XMM0_Ba_23;
  undefined1 extraout_XMM0_Ba_24;
  undefined1 extraout_XMM0_Ba_25;
  undefined1 extraout_XMM0_Ba_26;
  undefined1 extraout_XMM0_Ba_27;
  undefined1 extraout_XMM0_Ba_28;
  undefined1 extraout_XMM0_Ba_29;
  undefined1 extraout_XMM0_Ba_30;
  char extraout_XMM0_Ba_31;
  char extraout_XMM0_Ba_32;
  undefined1 extraout_XMM0_Ba_33;
  undefined1 extraout_XMM0_Ba_34;
  undefined1 extraout_XMM0_Ba_35;
  undefined1 extraout_XMM0_Ba_36;
  char cVar32;
  undefined1 extraout_XMM0_Ba_37;
  char extraout_XMM0_Ba_38;
  undefined1 extraout_XMM0_Ba_39;
  undefined1 extraout_XMM0_Ba_40;
  undefined1 extraout_XMM0_Ba_41;
  undefined1 extraout_XMM0_Ba_42;
  undefined1 extraout_XMM0_Bb;
  undefined1 extraout_XMM0_Bb_00;
  undefined1 extraout_XMM0_Bb_01;
  undefined1 extraout_XMM0_Bb_02;
  undefined1 extraout_XMM0_Bb_03;
  undefined1 extraout_XMM0_Bb_04;
  undefined1 extraout_XMM0_Bb_05;
  undefined1 uVar33;
  undefined1 extraout_XMM0_Bb_06;
  undefined1 extraout_XMM0_Bb_07;
  undefined1 extraout_XMM0_Bb_08;
  undefined1 extraout_XMM0_Bb_09;
  undefined1 extraout_XMM0_Bb_10;
  undefined1 extraout_XMM0_Bb_11;
  undefined1 extraout_XMM0_Bb_12;
  undefined1 extraout_XMM0_Bb_13;
  undefined1 extraout_XMM0_Bb_14;
  undefined1 extraout_XMM0_Bb_15;
  undefined1 extraout_XMM0_Bb_16;
  undefined1 extraout_XMM0_Bb_17;
  undefined1 extraout_XMM0_Bb_18;
  undefined1 extraout_XMM0_Bb_19;
  undefined1 extraout_XMM0_Bb_20;
  undefined1 extraout_XMM0_Bb_21;
  undefined1 extraout_XMM0_Bb_22;
  undefined1 extraout_XMM0_Bb_23;
  undefined1 extraout_XMM0_Bb_24;
  undefined1 extraout_XMM0_Bb_25;
  undefined1 extraout_XMM0_Bb_26;
  undefined1 extraout_XMM0_Bb_27;
  undefined1 extraout_XMM0_Bb_28;
  undefined1 extraout_XMM0_Bb_29;
  undefined1 extraout_XMM0_Bb_30;
  char extraout_XMM0_Bb_31;
  char extraout_XMM0_Bb_32;
  undefined1 extraout_XMM0_Bb_33;
  undefined1 extraout_XMM0_Bb_34;
  undefined1 extraout_XMM0_Bb_35;
  undefined1 extraout_XMM0_Bb_36;
  char cVar34;
  undefined1 extraout_XMM0_Bb_37;
  char extraout_XMM0_Bb_38;
  undefined1 extraout_XMM0_Bb_39;
  undefined1 extraout_XMM0_Bb_40;
  undefined1 extraout_XMM0_Bb_41;
  undefined1 extraout_XMM0_Bb_42;
  undefined1 extraout_XMM0_Bc;
  undefined1 extraout_XMM0_Bc_00;
  undefined1 uVar35;
  undefined1 extraout_XMM0_Bc_01;
  undefined1 extraout_XMM0_Bc_02;
  undefined1 extraout_XMM0_Bc_03;
  undefined1 extraout_XMM0_Bc_04;
  undefined1 extraout_XMM0_Bc_05;
  undefined1 extraout_XMM0_Bc_06;
  undefined1 extraout_XMM0_Bc_07;
  undefined1 extraout_XMM0_Bc_08;
  undefined1 extraout_XMM0_Bc_09;
  undefined1 extraout_XMM0_Bc_10;
  undefined1 extraout_XMM0_Bc_11;
  undefined1 extraout_XMM0_Bc_12;
  undefined1 extraout_XMM0_Bc_13;
  undefined1 extraout_XMM0_Bc_14;
  undefined1 extraout_XMM0_Bc_15;
  undefined1 extraout_XMM0_Bc_16;
  undefined1 extraout_XMM0_Bc_17;
  undefined1 extraout_XMM0_Bc_18;
  undefined1 extraout_XMM0_Bc_19;
  undefined1 extraout_XMM0_Bc_20;
  undefined1 extraout_XMM0_Bc_21;
  undefined1 extraout_XMM0_Bc_22;
  undefined1 extraout_XMM0_Bc_23;
  undefined1 extraout_XMM0_Bc_24;
  undefined1 extraout_XMM0_Bc_25;
  undefined1 extraout_XMM0_Bc_26;
  undefined1 extraout_XMM0_Bc_27;
  undefined1 extraout_XMM0_Bc_28;
  undefined1 extraout_XMM0_Bc_29;
  undefined1 extraout_XMM0_Bc_30;
  char extraout_XMM0_Bc_31;
  char extraout_XMM0_Bc_32;
  undefined1 extraout_XMM0_Bc_33;
  undefined1 extraout_XMM0_Bc_34;
  undefined1 extraout_XMM0_Bc_35;
  undefined1 extraout_XMM0_Bc_36;
  char cVar36;
  undefined1 extraout_XMM0_Bc_37;
  char extraout_XMM0_Bc_38;
  undefined1 extraout_XMM0_Bc_39;
  undefined1 extraout_XMM0_Bc_40;
  undefined1 extraout_XMM0_Bc_41;
  undefined1 extraout_XMM0_Bc_42;
  undefined1 extraout_XMM0_Bd;
  undefined1 extraout_XMM0_Bd_00;
  undefined1 uVar37;
  undefined1 extraout_XMM0_Bd_01;
  undefined1 extraout_XMM0_Bd_02;
  undefined1 extraout_XMM0_Bd_03;
  undefined1 extraout_XMM0_Bd_04;
  undefined1 extraout_XMM0_Bd_05;
  undefined1 extraout_XMM0_Bd_06;
  undefined1 extraout_XMM0_Bd_07;
  undefined1 extraout_XMM0_Bd_08;
  undefined1 extraout_XMM0_Bd_09;
  undefined1 extraout_XMM0_Bd_10;
  undefined1 extraout_XMM0_Bd_11;
  undefined1 extraout_XMM0_Bd_12;
  undefined1 extraout_XMM0_Bd_13;
  undefined1 extraout_XMM0_Bd_14;
  undefined1 extraout_XMM0_Bd_15;
  undefined1 extraout_XMM0_Bd_16;
  undefined1 extraout_XMM0_Bd_17;
  undefined1 extraout_XMM0_Bd_18;
  undefined1 extraout_XMM0_Bd_19;
  undefined1 extraout_XMM0_Bd_20;
  undefined1 extraout_XMM0_Bd_21;
  undefined1 extraout_XMM0_Bd_22;
  undefined1 extraout_XMM0_Bd_23;
  undefined1 extraout_XMM0_Bd_24;
  undefined1 extraout_XMM0_Bd_25;
  undefined1 extraout_XMM0_Bd_26;
  undefined1 extraout_XMM0_Bd_27;
  undefined1 extraout_XMM0_Bd_28;
  undefined1 extraout_XMM0_Bd_29;
  undefined1 extraout_XMM0_Bd_30;
  char extraout_XMM0_Bd_31;
  char extraout_XMM0_Bd_32;
  undefined1 extraout_XMM0_Bd_33;
  undefined1 extraout_XMM0_Bd_34;
  undefined1 extraout_XMM0_Bd_35;
  undefined1 extraout_XMM0_Bd_36;
  char cVar38;
  undefined1 extraout_XMM0_Bd_37;
  char extraout_XMM0_Bd_38;
  undefined1 extraout_XMM0_Bd_39;
  undefined1 extraout_XMM0_Bd_40;
  undefined1 extraout_XMM0_Bd_41;
  undefined1 extraout_XMM0_Bd_42;
  undefined1 extraout_XMM0_Be;
  char cVar39;
  undefined1 extraout_XMM0_Be_00;
  undefined1 extraout_XMM0_Be_01;
  undefined1 extraout_XMM0_Be_02;
  undefined1 extraout_XMM0_Bf;
  char cVar40;
  undefined1 extraout_XMM0_Bf_00;
  undefined1 extraout_XMM0_Bf_01;
  undefined1 extraout_XMM0_Bf_02;
  undefined1 extraout_XMM0_Bg;
  char cVar41;
  undefined1 extraout_XMM0_Bg_00;
  undefined1 extraout_XMM0_Bg_01;
  undefined1 extraout_XMM0_Bg_02;
  undefined1 extraout_XMM0_Bh;
  char cVar42;
  undefined1 extraout_XMM0_Bh_00;
  undefined1 extraout_XMM0_Bh_01;
  undefined1 extraout_XMM0_Bh_02;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  byte bVar50;
  char *local_180;
  float local_15c;
  float local_154;
  float local_14c;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138;
  undefined1 local_130 [8];
  ImVec4 border_col;
  ImVec4 tint_col;
  ImFontGlyph *glyph;
  ImVec2 cell_p2;
  ImVec2 cell_p1;
  int n_1;
  ImDrawList *draw_list;
  float fStack_d0;
  ImVec2 base_pos;
  float cell_spacing;
  float cell_size;
  int n;
  int count;
  int base;
  ImFontConfig *cfg;
  int config_i;
  float surface_sqrt;
  bool font_details_opened;
  ImFont *font;
  int i_2;
  ImFontAtlas *atlas;
  ImGuiIO *io;
  ImVec2 local_78;
  char *local_70;
  char *name_1;
  int i_1;
  char *local_58;
  char *name;
  ImVec4 *col;
  int i;
  int local_3c;
  int window_menu_button_position;
  ImVec2 local_30;
  bool local_27;
  bool local_26;
  bool local_25 [6];
  bool popup_border;
  bool frame_border;
  bool window_border;
  ImGuiStyle *local_18;
  ImGuiStyle *style;
  ImGuiStyle *ref_local;
  
  style = ref;
  local_18 = GetStyle();
  if ((ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') &&
     (iVar21 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style), iVar21 != 0)) {
    ImGuiStyle::ImGuiStyle(&ShowStyleEditor::ref_saved_style);
    __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
  }
  if (((ShowStyleEditor::init & 1U) != 0) && (style == (ImGuiStyle *)0x0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,local_18,0x3b0);
  }
  ShowStyleEditor::init = false;
  if (style == (ImGuiStyle *)0x0) {
    style = &ShowStyleEditor::ref_saved_style;
  }
  fVar8 = GetWindowWidth();
  PushItemWidth(fVar8 * 0.5);
  bVar19 = ShowStyleSelector("Colors##Selector");
  if (bVar19) {
    memcpy(&ShowStyleEditor::ref_saved_style,local_18,0x3b0);
  }
  ShowFontSelector("Fonts##Selector");
  bVar19 = SliderFloat("FrameRounding",&local_18->FrameRounding,
                       (float)(CONCAT13(extraout_XMM0_Bd,
                                        CONCAT12(extraout_XMM0_Bc,
                                                 CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba))) ^
                              CONCAT13(extraout_XMM0_Bd,
                                       CONCAT12(extraout_XMM0_Bc,
                                                CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba)))),12.0,
                       "%.0f",1.0);
  if (bVar19) {
    local_18->GrabRounding = local_18->FrameRounding;
  }
  local_25[0] = 0.0 < local_18->WindowBorderSize;
  bVar19 = Checkbox("WindowBorder",local_25);
  uVar31 = extraout_XMM0_Ba_00;
  uVar33 = extraout_XMM0_Bb_00;
  uVar35 = extraout_XMM0_Bc_00;
  uVar37 = extraout_XMM0_Bd_00;
  if (bVar19) {
    local_14c = 1.0;
    if ((local_25[0] & 1U) == 0) {
      local_14c = 0.0;
    }
    uVar31 = 0;
    uVar33 = 0;
    uVar35 = (undefined1)((uint)local_14c >> 0x10);
    uVar37 = (undefined1)((uint)local_14c >> 0x18);
    local_18->WindowBorderSize = local_14c;
  }
  SameLine((float)(CONCAT13(uVar37,CONCAT12(uVar35,CONCAT11(uVar33,uVar31))) ^
                  CONCAT13(uVar37,CONCAT12(uVar35,CONCAT11(uVar33,uVar31)))),-1.0);
  local_26 = 0.0 < local_18->FrameBorderSize;
  bVar19 = Checkbox("FrameBorder",&local_26);
  uVar31 = extraout_XMM0_Ba_01;
  uVar33 = extraout_XMM0_Bb_01;
  uVar35 = extraout_XMM0_Bc_01;
  uVar37 = extraout_XMM0_Bd_01;
  if (bVar19) {
    local_154 = 1.0;
    if ((local_26 & 1U) == 0) {
      local_154 = 0.0;
    }
    uVar31 = 0;
    uVar33 = 0;
    uVar35 = (undefined1)((uint)local_154 >> 0x10);
    uVar37 = (undefined1)((uint)local_154 >> 0x18);
    local_18->FrameBorderSize = local_154;
  }
  SameLine((float)(CONCAT13(uVar37,CONCAT12(uVar35,CONCAT11(uVar33,uVar31))) ^
                  CONCAT13(uVar37,CONCAT12(uVar35,CONCAT11(uVar33,uVar31)))),-1.0);
  local_27 = 0.0 < local_18->PopupBorderSize;
  bVar19 = Checkbox("PopupBorder",&local_27);
  if (bVar19) {
    local_15c = 1.0;
    if ((local_27 & 1U) == 0) {
      local_15c = 0.0;
    }
    local_18->PopupBorderSize = local_15c;
  }
  ImVec2::ImVec2(&local_30,0.0,0.0);
  bVar19 = Button("Save Ref",&local_30);
  uVar31 = extraout_XMM0_Ba_02;
  uVar33 = extraout_XMM0_Bb_02;
  uVar35 = extraout_XMM0_Bc_02;
  uVar37 = extraout_XMM0_Bd_02;
  if (bVar19) {
    memcpy(&ShowStyleEditor::ref_saved_style,local_18,0x3b0);
    memcpy(style,&ShowStyleEditor::ref_saved_style,0x3b0);
    uVar31 = extraout_XMM0_Ba_03;
    uVar33 = extraout_XMM0_Bb_03;
    uVar35 = extraout_XMM0_Bc_03;
    uVar37 = extraout_XMM0_Bd_03;
  }
  SameLine((float)(CONCAT13(uVar37,CONCAT12(uVar35,CONCAT11(uVar33,uVar31))) ^
                  CONCAT13(uVar37,CONCAT12(uVar35,CONCAT11(uVar33,uVar31)))),-1.0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc8,0.0,0.0);
  bVar19 = Button("Revert Ref",(ImVec2 *)&stack0xffffffffffffffc8);
  uVar31 = extraout_XMM0_Ba_04;
  uVar33 = extraout_XMM0_Bb_04;
  uVar35 = extraout_XMM0_Bc_04;
  uVar37 = extraout_XMM0_Bd_04;
  if (bVar19) {
    memcpy(local_18,style,0x3b0);
    uVar31 = extraout_XMM0_Ba_05;
    uVar33 = extraout_XMM0_Bb_05;
    uVar35 = extraout_XMM0_Bc_05;
    uVar37 = extraout_XMM0_Bd_05;
  }
  SameLine((float)(CONCAT13(uVar37,CONCAT12(uVar35,CONCAT11(uVar33,uVar31))) ^
                  CONCAT13(uVar37,CONCAT12(uVar35,CONCAT11(uVar33,uVar31)))),-1.0);
  HelpMarker(
            "Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere."
            );
  Separator();
  bVar19 = BeginTabBar("##tabs",0);
  if (bVar19) {
    bVar19 = BeginTabItem("Sizes",(bool *)0x0,0);
    if (bVar19) {
      Text("Main");
      SliderFloat2("WindowPadding",&(local_18->WindowPadding).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_06,
                                    CONCAT12(extraout_XMM0_Bc_06,
                                             CONCAT11(extraout_XMM0_Bb_06,extraout_XMM0_Ba_06))) ^
                          CONCAT13(extraout_XMM0_Bd_06,
                                   CONCAT12(extraout_XMM0_Bc_06,
                                            CONCAT11(extraout_XMM0_Bb_06,extraout_XMM0_Ba_06)))),
                   20.0,"%.0f",1.0);
      SliderFloat2("FramePadding",&(local_18->FramePadding).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_07,
                                    CONCAT12(extraout_XMM0_Bc_07,
                                             CONCAT11(extraout_XMM0_Bb_07,extraout_XMM0_Ba_07))) ^
                          CONCAT13(extraout_XMM0_Bd_07,
                                   CONCAT12(extraout_XMM0_Bc_07,
                                            CONCAT11(extraout_XMM0_Bb_07,extraout_XMM0_Ba_07)))),
                   20.0,"%.0f",1.0);
      SliderFloat2("ItemSpacing",&(local_18->ItemSpacing).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_08,
                                    CONCAT12(extraout_XMM0_Bc_08,
                                             CONCAT11(extraout_XMM0_Bb_08,extraout_XMM0_Ba_08))) ^
                          CONCAT13(extraout_XMM0_Bd_08,
                                   CONCAT12(extraout_XMM0_Bc_08,
                                            CONCAT11(extraout_XMM0_Bb_08,extraout_XMM0_Ba_08)))),
                   20.0,"%.0f",1.0);
      SliderFloat2("ItemInnerSpacing",&(local_18->ItemInnerSpacing).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_09,
                                    CONCAT12(extraout_XMM0_Bc_09,
                                             CONCAT11(extraout_XMM0_Bb_09,extraout_XMM0_Ba_09))) ^
                          CONCAT13(extraout_XMM0_Bd_09,
                                   CONCAT12(extraout_XMM0_Bc_09,
                                            CONCAT11(extraout_XMM0_Bb_09,extraout_XMM0_Ba_09)))),
                   20.0,"%.0f",1.0);
      SliderFloat2("TouchExtraPadding",&(local_18->TouchExtraPadding).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_10,
                                    CONCAT12(extraout_XMM0_Bc_10,
                                             CONCAT11(extraout_XMM0_Bb_10,extraout_XMM0_Ba_10))) ^
                          CONCAT13(extraout_XMM0_Bd_10,
                                   CONCAT12(extraout_XMM0_Bc_10,
                                            CONCAT11(extraout_XMM0_Bb_10,extraout_XMM0_Ba_10)))),
                   10.0,"%.0f",1.0);
      SliderFloat("IndentSpacing",&local_18->IndentSpacing,
                  (float)(CONCAT13(extraout_XMM0_Bd_11,
                                   CONCAT12(extraout_XMM0_Bc_11,
                                            CONCAT11(extraout_XMM0_Bb_11,extraout_XMM0_Ba_11))) ^
                         CONCAT13(extraout_XMM0_Bd_11,
                                  CONCAT12(extraout_XMM0_Bc_11,
                                           CONCAT11(extraout_XMM0_Bb_11,extraout_XMM0_Ba_11)))),30.0
                  ,"%.0f",1.0);
      SliderFloat("ScrollbarSize",&local_18->ScrollbarSize,1.0,20.0,"%.0f",1.0);
      SliderFloat("GrabMinSize",&local_18->GrabMinSize,1.0,20.0,"%.0f",1.0);
      Text("Borders");
      SliderFloat("WindowBorderSize",&local_18->WindowBorderSize,
                  (float)(CONCAT13(extraout_XMM0_Bd_12,
                                   CONCAT12(extraout_XMM0_Bc_12,
                                            CONCAT11(extraout_XMM0_Bb_12,extraout_XMM0_Ba_12))) ^
                         CONCAT13(extraout_XMM0_Bd_12,
                                  CONCAT12(extraout_XMM0_Bc_12,
                                           CONCAT11(extraout_XMM0_Bb_12,extraout_XMM0_Ba_12)))),1.0,
                  "%.0f",1.0);
      SliderFloat("ChildBorderSize",&local_18->ChildBorderSize,
                  (float)(CONCAT13(extraout_XMM0_Bd_13,
                                   CONCAT12(extraout_XMM0_Bc_13,
                                            CONCAT11(extraout_XMM0_Bb_13,extraout_XMM0_Ba_13))) ^
                         CONCAT13(extraout_XMM0_Bd_13,
                                  CONCAT12(extraout_XMM0_Bc_13,
                                           CONCAT11(extraout_XMM0_Bb_13,extraout_XMM0_Ba_13)))),1.0,
                  "%.0f",1.0);
      SliderFloat("PopupBorderSize",&local_18->PopupBorderSize,
                  (float)(CONCAT13(extraout_XMM0_Bd_14,
                                   CONCAT12(extraout_XMM0_Bc_14,
                                            CONCAT11(extraout_XMM0_Bb_14,extraout_XMM0_Ba_14))) ^
                         CONCAT13(extraout_XMM0_Bd_14,
                                  CONCAT12(extraout_XMM0_Bc_14,
                                           CONCAT11(extraout_XMM0_Bb_14,extraout_XMM0_Ba_14)))),1.0,
                  "%.0f",1.0);
      SliderFloat("FrameBorderSize",&local_18->FrameBorderSize,
                  (float)(CONCAT13(extraout_XMM0_Bd_15,
                                   CONCAT12(extraout_XMM0_Bc_15,
                                            CONCAT11(extraout_XMM0_Bb_15,extraout_XMM0_Ba_15))) ^
                         CONCAT13(extraout_XMM0_Bd_15,
                                  CONCAT12(extraout_XMM0_Bc_15,
                                           CONCAT11(extraout_XMM0_Bb_15,extraout_XMM0_Ba_15)))),1.0,
                  "%.0f",1.0);
      SliderFloat("TabBorderSize",&local_18->TabBorderSize,
                  (float)(CONCAT13(extraout_XMM0_Bd_16,
                                   CONCAT12(extraout_XMM0_Bc_16,
                                            CONCAT11(extraout_XMM0_Bb_16,extraout_XMM0_Ba_16))) ^
                         CONCAT13(extraout_XMM0_Bd_16,
                                  CONCAT12(extraout_XMM0_Bc_16,
                                           CONCAT11(extraout_XMM0_Bb_16,extraout_XMM0_Ba_16)))),1.0,
                  "%.0f",1.0);
      Text("Rounding");
      SliderFloat("WindowRounding",&local_18->WindowRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_17,
                                   CONCAT12(extraout_XMM0_Bc_17,
                                            CONCAT11(extraout_XMM0_Bb_17,extraout_XMM0_Ba_17))) ^
                         CONCAT13(extraout_XMM0_Bd_17,
                                  CONCAT12(extraout_XMM0_Bc_17,
                                           CONCAT11(extraout_XMM0_Bb_17,extraout_XMM0_Ba_17)))),12.0
                  ,"%.0f",1.0);
      SliderFloat("ChildRounding",&local_18->ChildRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_18,
                                   CONCAT12(extraout_XMM0_Bc_18,
                                            CONCAT11(extraout_XMM0_Bb_18,extraout_XMM0_Ba_18))) ^
                         CONCAT13(extraout_XMM0_Bd_18,
                                  CONCAT12(extraout_XMM0_Bc_18,
                                           CONCAT11(extraout_XMM0_Bb_18,extraout_XMM0_Ba_18)))),12.0
                  ,"%.0f",1.0);
      SliderFloat("FrameRounding",&local_18->FrameRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_19,
                                   CONCAT12(extraout_XMM0_Bc_19,
                                            CONCAT11(extraout_XMM0_Bb_19,extraout_XMM0_Ba_19))) ^
                         CONCAT13(extraout_XMM0_Bd_19,
                                  CONCAT12(extraout_XMM0_Bc_19,
                                           CONCAT11(extraout_XMM0_Bb_19,extraout_XMM0_Ba_19)))),12.0
                  ,"%.0f",1.0);
      SliderFloat("PopupRounding",&local_18->PopupRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_20,
                                   CONCAT12(extraout_XMM0_Bc_20,
                                            CONCAT11(extraout_XMM0_Bb_20,extraout_XMM0_Ba_20))) ^
                         CONCAT13(extraout_XMM0_Bd_20,
                                  CONCAT12(extraout_XMM0_Bc_20,
                                           CONCAT11(extraout_XMM0_Bb_20,extraout_XMM0_Ba_20)))),12.0
                  ,"%.0f",1.0);
      SliderFloat("ScrollbarRounding",&local_18->ScrollbarRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_21,
                                   CONCAT12(extraout_XMM0_Bc_21,
                                            CONCAT11(extraout_XMM0_Bb_21,extraout_XMM0_Ba_21))) ^
                         CONCAT13(extraout_XMM0_Bd_21,
                                  CONCAT12(extraout_XMM0_Bc_21,
                                           CONCAT11(extraout_XMM0_Bb_21,extraout_XMM0_Ba_21)))),12.0
                  ,"%.0f",1.0);
      SliderFloat("GrabRounding",&local_18->GrabRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_22,
                                   CONCAT12(extraout_XMM0_Bc_22,
                                            CONCAT11(extraout_XMM0_Bb_22,extraout_XMM0_Ba_22))) ^
                         CONCAT13(extraout_XMM0_Bd_22,
                                  CONCAT12(extraout_XMM0_Bc_22,
                                           CONCAT11(extraout_XMM0_Bb_22,extraout_XMM0_Ba_22)))),12.0
                  ,"%.0f",1.0);
      SliderFloat("TabRounding",&local_18->TabRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_23,
                                   CONCAT12(extraout_XMM0_Bc_23,
                                            CONCAT11(extraout_XMM0_Bb_23,extraout_XMM0_Ba_23))) ^
                         CONCAT13(extraout_XMM0_Bd_23,
                                  CONCAT12(extraout_XMM0_Bc_23,
                                           CONCAT11(extraout_XMM0_Bb_23,extraout_XMM0_Ba_23)))),12.0
                  ,"%.0f",1.0);
      Text("Alignment");
      SliderFloat2("WindowTitleAlign",&(local_18->WindowTitleAlign).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_24,
                                    CONCAT12(extraout_XMM0_Bc_24,
                                             CONCAT11(extraout_XMM0_Bb_24,extraout_XMM0_Ba_24))) ^
                          CONCAT13(extraout_XMM0_Bd_24,
                                   CONCAT12(extraout_XMM0_Bc_24,
                                            CONCAT11(extraout_XMM0_Bb_24,extraout_XMM0_Ba_24)))),1.0
                   ,"%.2f",1.0);
      local_3c = local_18->WindowMenuButtonPosition + 1;
      bVar19 = Combo("WindowMenuButtonPosition",&local_3c,"None",-1);
      if (bVar19) {
        local_18->WindowMenuButtonPosition = local_3c + -1;
      }
      Combo("ColorButtonPosition",&local_18->ColorButtonPosition,"Left",-1);
      SliderFloat2("ButtonTextAlign",&(local_18->ButtonTextAlign).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_25,
                                    CONCAT12(extraout_XMM0_Bc_25,
                                             CONCAT11(extraout_XMM0_Bb_25,extraout_XMM0_Ba_25))) ^
                          CONCAT13(extraout_XMM0_Bd_25,
                                   CONCAT12(extraout_XMM0_Bc_25,
                                            CONCAT11(extraout_XMM0_Bb_25,extraout_XMM0_Ba_25)))),1.0
                   ,"%.2f",1.0);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_26,
                                CONCAT12(extraout_XMM0_Bc_26,
                                         CONCAT11(extraout_XMM0_Bb_26,extraout_XMM0_Ba_26))) ^
                      CONCAT13(extraout_XMM0_Bd_26,
                               CONCAT12(extraout_XMM0_Bc_26,
                                        CONCAT11(extraout_XMM0_Bb_26,extraout_XMM0_Ba_26)))),-1.0);
      HelpMarker("Alignment applies when a button is larger than its text content.");
      SliderFloat2("SelectableTextAlign",&(local_18->SelectableTextAlign).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_27,
                                    CONCAT12(extraout_XMM0_Bc_27,
                                             CONCAT11(extraout_XMM0_Bb_27,extraout_XMM0_Ba_27))) ^
                          CONCAT13(extraout_XMM0_Bd_27,
                                   CONCAT12(extraout_XMM0_Bc_27,
                                            CONCAT11(extraout_XMM0_Bb_27,extraout_XMM0_Ba_27)))),1.0
                   ,"%.2f",1.0);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_28,
                                CONCAT12(extraout_XMM0_Bc_28,
                                         CONCAT11(extraout_XMM0_Bb_28,extraout_XMM0_Ba_28))) ^
                      CONCAT13(extraout_XMM0_Bd_28,
                               CONCAT12(extraout_XMM0_Bc_28,
                                        CONCAT11(extraout_XMM0_Bb_28,extraout_XMM0_Ba_28)))),-1.0);
      HelpMarker("Alignment applies when a selectable is larger than its text content.");
      Text("Safe Area Padding");
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_29,
                                CONCAT12(extraout_XMM0_Bc_29,
                                         CONCAT11(extraout_XMM0_Bb_29,extraout_XMM0_Ba_29))) ^
                      CONCAT13(extraout_XMM0_Bd_29,
                               CONCAT12(extraout_XMM0_Bc_29,
                                        CONCAT11(extraout_XMM0_Bb_29,extraout_XMM0_Ba_29)))),-1.0);
      HelpMarker(
                "Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured)."
                );
      SliderFloat2("DisplaySafeAreaPadding",&(local_18->DisplaySafeAreaPadding).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_30,
                                    CONCAT12(extraout_XMM0_Bc_30,
                                             CONCAT11(extraout_XMM0_Bb_30,extraout_XMM0_Ba_30))) ^
                          CONCAT13(extraout_XMM0_Bd_30,
                                   CONCAT12(extraout_XMM0_Bc_30,
                                            CONCAT11(extraout_XMM0_Bb_30,extraout_XMM0_Ba_30)))),
                   30.0,"%.0f",1.0);
      EndTabItem();
    }
    bVar19 = BeginTabItem("Colors",(bool *)0x0,0);
    if (bVar19) {
      ImVec2::ImVec2((ImVec2 *)((long)&col + 4),0.0,0.0);
      bVar19 = Button("Export",(ImVec2 *)((long)&col + 4));
      cVar32 = extraout_XMM0_Ba_31;
      cVar34 = extraout_XMM0_Bb_31;
      cVar36 = extraout_XMM0_Bc_31;
      cVar38 = extraout_XMM0_Bd_31;
      if (bVar19) {
        if (ShowStyleEditor::output_dest == 0) {
          LogToClipboard(-1);
        }
        else {
          LogToTTY(-1);
        }
        LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
        for (col._0_4_ = 0; (int)col < 0x30; col._0_4_ = (int)col + 1) {
          name = (char *)(local_18->Colors + (int)col);
          pcVar30 = GetStyleColorName((int)col);
          local_58 = pcVar30;
          if ((ShowStyleEditor::output_only_modified & 1U) == 0) {
LAB_001368b7:
            sVar23 = strlen(pcVar30);
            LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",
                    CONCAT17(extraout_XMM0_Bh,
                             CONCAT16(extraout_XMM0_Bg,
                                      CONCAT15(extraout_XMM0_Bf,
                                               CONCAT14(extraout_XMM0_Be,
                                                        CONCAT13(cVar38,CONCAT12(cVar36,CONCAT11(
                                                  cVar34,cVar32))))))),(double)*(float *)(name + 4),
                    (double)*(float *)(name + 8),(double)*(float *)(name + 0xc),pcVar30,
                    (ulong)(0x17 - (int)sVar23),"");
          }
          else {
            IVar2 = style->Colors[(int)col];
            cVar32 = -(*name == IVar2.x._0_1_);
            cVar34 = -(name[1] == IVar2.x._1_1_);
            cVar36 = -(name[2] == IVar2.x._2_1_);
            cVar38 = -(name[3] == IVar2.x._3_1_);
            cVar39 = -(name[4] == IVar2.y._0_1_);
            cVar40 = -(name[5] == IVar2.y._1_1_);
            cVar41 = -(name[6] == IVar2.y._2_1_);
            cVar42 = -(name[7] == IVar2.y._3_1_);
            cVar43 = -(name[8] == IVar2.z._0_1_);
            cVar44 = -(name[9] == IVar2.z._1_1_);
            cVar45 = -(name[10] == IVar2.z._2_1_);
            cVar46 = -(name[0xb] == IVar2.z._3_1_);
            cVar47 = -(name[0xc] == IVar2.w._0_1_);
            cVar48 = -(name[0xd] == IVar2.w._1_1_);
            cVar49 = -(name[0xe] == IVar2.w._2_1_);
            bVar50 = -(name[0xf] == IVar2.w._3_1_);
            auVar6[1] = cVar34;
            auVar6[0] = cVar32;
            auVar6[2] = cVar36;
            auVar6[3] = cVar38;
            auVar6[4] = cVar39;
            auVar6[5] = cVar40;
            auVar6[6] = cVar41;
            auVar6[7] = cVar42;
            auVar6[8] = cVar43;
            auVar6[9] = cVar44;
            auVar6[10] = cVar45;
            auVar6[0xb] = cVar46;
            auVar6[0xc] = cVar47;
            auVar6[0xd] = cVar48;
            auVar6[0xe] = cVar49;
            auVar6[0xf] = bVar50;
            auVar7[1] = cVar34;
            auVar7[0] = cVar32;
            auVar7[2] = cVar36;
            auVar7[3] = cVar38;
            auVar7[4] = cVar39;
            auVar7[5] = cVar40;
            auVar7[6] = cVar41;
            auVar7[7] = cVar42;
            auVar7[8] = cVar43;
            auVar7[9] = cVar44;
            auVar7[10] = cVar45;
            auVar7[0xb] = cVar46;
            auVar7[0xc] = cVar47;
            auVar7[0xd] = cVar48;
            auVar7[0xe] = cVar49;
            auVar7[0xf] = bVar50;
            auVar16[1] = cVar38;
            auVar16[0] = cVar36;
            auVar16[2] = cVar39;
            auVar16[3] = cVar40;
            auVar16[4] = cVar41;
            auVar16[5] = cVar42;
            auVar16[6] = cVar43;
            auVar16[7] = cVar44;
            auVar16[8] = cVar45;
            auVar16[9] = cVar46;
            auVar16[10] = cVar47;
            auVar16[0xb] = cVar48;
            auVar16[0xc] = cVar49;
            auVar16[0xd] = bVar50;
            auVar14[1] = cVar39;
            auVar14[0] = cVar38;
            auVar14[2] = cVar40;
            auVar14[3] = cVar41;
            auVar14[4] = cVar42;
            auVar14[5] = cVar43;
            auVar14[6] = cVar44;
            auVar14[7] = cVar45;
            auVar14[8] = cVar46;
            auVar14[9] = cVar47;
            auVar14[10] = cVar48;
            auVar14[0xb] = cVar49;
            auVar14[0xc] = bVar50;
            auVar12[1] = cVar40;
            auVar12[0] = cVar39;
            auVar12[2] = cVar41;
            auVar12[3] = cVar42;
            auVar12[4] = cVar43;
            auVar12[5] = cVar44;
            auVar12[6] = cVar45;
            auVar12[7] = cVar46;
            auVar12[8] = cVar47;
            auVar12[9] = cVar48;
            auVar12[10] = cVar49;
            auVar12[0xb] = bVar50;
            auVar10[1] = cVar41;
            auVar10[0] = cVar40;
            auVar10[2] = cVar42;
            auVar10[3] = cVar43;
            auVar10[4] = cVar44;
            auVar10[5] = cVar45;
            auVar10[6] = cVar46;
            auVar10[7] = cVar47;
            auVar10[8] = cVar48;
            auVar10[9] = cVar49;
            auVar10[10] = bVar50;
            if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB141(auVar16 >> 7,0) & 1) << 2 |
                         (ushort)(SUB131(auVar14 >> 7,0) & 1) << 3 |
                         (ushort)(SUB121(auVar12 >> 7,0) & 1) << 4 |
                         (ushort)(SUB111(auVar10 >> 7,0) & 1) << 5 |
                         (ushort)((byte)(CONCAT19(bVar50,CONCAT18(cVar49,CONCAT17(cVar48,CONCAT16(
                                                  cVar47,CONCAT15(cVar46,CONCAT14(cVar45,CONCAT13(
                                                  cVar44,CONCAT12(cVar43,CONCAT11(cVar42,cVar41)))))
                                                  )))) >> 7) & 1) << 6 |
                         (ushort)((byte)(CONCAT18(bVar50,CONCAT17(cVar49,CONCAT16(cVar48,CONCAT15(
                                                  cVar47,CONCAT14(cVar46,CONCAT13(cVar45,CONCAT12(
                                                  cVar44,CONCAT11(cVar43,cVar42)))))))) >> 7) & 1)
                         << 7 | (ushort)(bVar50 >> 7) << 0xf) != 0xffff) goto LAB_001368b7;
          }
        }
        LogFinish();
        cVar32 = extraout_XMM0_Ba_32;
        cVar34 = extraout_XMM0_Bb_32;
        cVar36 = extraout_XMM0_Bc_32;
        cVar38 = extraout_XMM0_Bd_32;
      }
      SameLine((float)(CONCAT13(cVar38,CONCAT12(cVar36,CONCAT11(cVar34,cVar32))) ^
                      CONCAT13(cVar38,CONCAT12(cVar36,CONCAT11(cVar34,cVar32)))),-1.0);
      SetNextItemWidth(120.0);
      Combo("##output_type",&ShowStyleEditor::output_dest,"To Clipboard",-1);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_33,
                                CONCAT12(extraout_XMM0_Bc_33,
                                         CONCAT11(extraout_XMM0_Bb_33,extraout_XMM0_Ba_33))) ^
                      CONCAT13(extraout_XMM0_Bd_33,
                               CONCAT12(extraout_XMM0_Bc_33,
                                        CONCAT11(extraout_XMM0_Bb_33,extraout_XMM0_Ba_33)))),-1.0);
      Checkbox("Only Modified Colors",&ShowStyleEditor::output_only_modified);
      if ((ShowStyleEditor(ImGuiStyle*)::filter == '\0') &&
         (iVar21 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter), iVar21 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter(&ShowStyleEditor::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
        __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
      }
      fVar8 = GetFontSize();
      ImGuiTextFilter::Draw(&ShowStyleEditor::filter,"Filter colors",fVar8 * 16.0);
      RadioButton("Opaque",&ShowStyleEditor::alpha_flags,0);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_34,
                                CONCAT12(extraout_XMM0_Bc_34,
                                         CONCAT11(extraout_XMM0_Bb_34,extraout_XMM0_Ba_34))) ^
                      CONCAT13(extraout_XMM0_Bd_34,
                               CONCAT12(extraout_XMM0_Bc_34,
                                        CONCAT11(extraout_XMM0_Bb_34,extraout_XMM0_Ba_34)))),-1.0);
      RadioButton("Alpha",&ShowStyleEditor::alpha_flags,0x20000);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_35,
                                CONCAT12(extraout_XMM0_Bc_35,
                                         CONCAT11(extraout_XMM0_Bb_35,extraout_XMM0_Ba_35))) ^
                      CONCAT13(extraout_XMM0_Bd_35,
                               CONCAT12(extraout_XMM0_Bc_35,
                                        CONCAT11(extraout_XMM0_Bb_35,extraout_XMM0_Ba_35)))),-1.0);
      RadioButton("Both",&ShowStyleEditor::alpha_flags,0x40000);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_36,
                                CONCAT12(extraout_XMM0_Bc_36,
                                         CONCAT11(extraout_XMM0_Bb_36,extraout_XMM0_Ba_36))) ^
                      CONCAT13(extraout_XMM0_Bd_36,
                               CONCAT12(extraout_XMM0_Bc_36,
                                        CONCAT11(extraout_XMM0_Bb_36,extraout_XMM0_Ba_36)))),-1.0);
      HelpMarker(
                "In the color list:\nLeft-click on colored square to open color picker,\nRight-click to open edit options menu."
                );
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,0.0,0.0);
      BeginChild("##colors",(ImVec2 *)&stack0xffffffffffffffa0,true,0x80c000);
      PushItemWidth(-160.0);
      for (name_1._4_4_ = 0; name_1._4_4_ < 0x30; name_1._4_4_ = name_1._4_4_ + 1) {
        local_70 = GetStyleColorName(name_1._4_4_);
        bVar19 = ImGuiTextFilter::PassFilter(&ShowStyleEditor::filter,local_70,(char *)0x0);
        if (bVar19) {
          PushID(name_1._4_4_);
          ColorEdit4("##color",&local_18->Colors[name_1._4_4_].x,
                     ShowStyleEditor::alpha_flags | 0x10000);
          pIVar24 = local_18->Colors + name_1._4_4_;
          IVar2 = style->Colors[name_1._4_4_];
          cVar32 = -(*(char *)&pIVar24->x == IVar2.x._0_1_);
          cVar34 = -(*(undefined1 *)((long)&pIVar24->x + 1) == IVar2.x._1_1_);
          cVar36 = -(*(undefined1 *)((long)&pIVar24->x + 2) == IVar2.x._2_1_);
          cVar38 = -(*(undefined1 *)((long)&pIVar24->x + 3) == IVar2.x._3_1_);
          cVar39 = -(*(char *)&pIVar24->y == IVar2.y._0_1_);
          cVar40 = -(*(undefined1 *)((long)&pIVar24->y + 1) == IVar2.y._1_1_);
          cVar41 = -(*(undefined1 *)((long)&pIVar24->y + 2) == IVar2.y._2_1_);
          cVar42 = -(*(undefined1 *)((long)&pIVar24->y + 3) == IVar2.y._3_1_);
          cVar43 = -(*(char *)&pIVar24->z == IVar2.z._0_1_);
          cVar44 = -(*(undefined1 *)((long)&pIVar24->z + 1) == IVar2.z._1_1_);
          cVar45 = -(*(undefined1 *)((long)&pIVar24->z + 2) == IVar2.z._2_1_);
          cVar46 = -(*(undefined1 *)((long)&pIVar24->z + 3) == IVar2.z._3_1_);
          cVar47 = -(*(char *)&pIVar24->w == IVar2.w._0_1_);
          cVar48 = -(*(undefined1 *)((long)&pIVar24->w + 1) == IVar2.w._1_1_);
          cVar49 = -(*(undefined1 *)((long)&pIVar24->w + 2) == IVar2.w._2_1_);
          bVar50 = -(*(undefined1 *)((long)&pIVar24->w + 3) == IVar2.w._3_1_);
          auVar4[1] = cVar34;
          auVar4[0] = cVar32;
          auVar4[2] = cVar36;
          auVar4[3] = cVar38;
          auVar4[4] = cVar39;
          auVar4[5] = cVar40;
          auVar4[6] = cVar41;
          auVar4[7] = cVar42;
          auVar4[8] = cVar43;
          auVar4[9] = cVar44;
          auVar4[10] = cVar45;
          auVar4[0xb] = cVar46;
          auVar4[0xc] = cVar47;
          auVar4[0xd] = cVar48;
          auVar4[0xe] = cVar49;
          auVar4[0xf] = bVar50;
          auVar5[1] = cVar34;
          auVar5[0] = cVar32;
          auVar5[2] = cVar36;
          auVar5[3] = cVar38;
          auVar5[4] = cVar39;
          auVar5[5] = cVar40;
          auVar5[6] = cVar41;
          auVar5[7] = cVar42;
          auVar5[8] = cVar43;
          auVar5[9] = cVar44;
          auVar5[10] = cVar45;
          auVar5[0xb] = cVar46;
          auVar5[0xc] = cVar47;
          auVar5[0xd] = cVar48;
          auVar5[0xe] = cVar49;
          auVar5[0xf] = bVar50;
          auVar17[1] = cVar38;
          auVar17[0] = cVar36;
          auVar17[2] = cVar39;
          auVar17[3] = cVar40;
          auVar17[4] = cVar41;
          auVar17[5] = cVar42;
          auVar17[6] = cVar43;
          auVar17[7] = cVar44;
          auVar17[8] = cVar45;
          auVar17[9] = cVar46;
          auVar17[10] = cVar47;
          auVar17[0xb] = cVar48;
          auVar17[0xc] = cVar49;
          auVar17[0xd] = bVar50;
          auVar15[1] = cVar39;
          auVar15[0] = cVar38;
          auVar15[2] = cVar40;
          auVar15[3] = cVar41;
          auVar15[4] = cVar42;
          auVar15[5] = cVar43;
          auVar15[6] = cVar44;
          auVar15[7] = cVar45;
          auVar15[8] = cVar46;
          auVar15[9] = cVar47;
          auVar15[10] = cVar48;
          auVar15[0xb] = cVar49;
          auVar15[0xc] = bVar50;
          auVar13[1] = cVar40;
          auVar13[0] = cVar39;
          auVar13[2] = cVar41;
          auVar13[3] = cVar42;
          auVar13[4] = cVar43;
          auVar13[5] = cVar44;
          auVar13[6] = cVar45;
          auVar13[7] = cVar46;
          auVar13[8] = cVar47;
          auVar13[9] = cVar48;
          auVar13[10] = cVar49;
          auVar13[0xb] = bVar50;
          auVar11[1] = cVar41;
          auVar11[0] = cVar40;
          auVar11[2] = cVar42;
          auVar11[3] = cVar43;
          auVar11[4] = cVar44;
          auVar11[5] = cVar45;
          auVar11[6] = cVar46;
          auVar11[7] = cVar47;
          auVar11[8] = cVar48;
          auVar11[9] = cVar49;
          auVar11[10] = bVar50;
          if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB141(auVar17 >> 7,0) & 1) << 2 |
                       (ushort)(SUB131(auVar15 >> 7,0) & 1) << 3 |
                       (ushort)(SUB121(auVar13 >> 7,0) & 1) << 4 |
                       (ushort)(SUB111(auVar11 >> 7,0) & 1) << 5 |
                       (ushort)((byte)(CONCAT19(bVar50,CONCAT18(cVar49,CONCAT17(cVar48,CONCAT16(
                                                  cVar47,CONCAT15(cVar46,CONCAT14(cVar45,CONCAT13(
                                                  cVar44,CONCAT12(cVar43,CONCAT11(cVar42,cVar41)))))
                                                  )))) >> 7) & 1) << 6 |
                       (ushort)((byte)(CONCAT18(bVar50,CONCAT17(cVar49,CONCAT16(cVar48,CONCAT15(
                                                  cVar47,CONCAT14(cVar46,CONCAT13(cVar45,CONCAT12(
                                                  cVar44,CONCAT11(cVar43,cVar42)))))))) >> 7) & 1)
                       << 7 | (ushort)(bVar50 >> 7) << 0xf) != 0xffff) {
            SameLine((float)(CONCAT13(cVar38,CONCAT12(cVar36,CONCAT11(cVar34,cVar32))) ^
                            CONCAT13(cVar38,CONCAT12(cVar36,CONCAT11(cVar34,cVar32)))),
                     (local_18->ItemInnerSpacing).x);
            ImVec2::ImVec2(&local_78,0.0,0.0);
            bVar19 = Button("Save",&local_78);
            if (bVar19) {
              pIVar29 = local_18->Colors + name_1._4_4_;
              pIVar24 = style->Colors + name_1._4_4_;
              fVar8 = pIVar29->y;
              pIVar24->x = pIVar29->x;
              pIVar24->y = fVar8;
              fVar8 = pIVar29->w;
              pIVar24->z = pIVar29->z;
              pIVar24->w = fVar8;
            }
            SameLine((float)(CONCAT13(extraout_XMM0_Bd_37,
                                      CONCAT12(extraout_XMM0_Bc_37,
                                               CONCAT11(extraout_XMM0_Bb_37,extraout_XMM0_Ba_37))) ^
                            CONCAT13(extraout_XMM0_Bd_37,
                                     CONCAT12(extraout_XMM0_Bc_37,
                                              CONCAT11(extraout_XMM0_Bb_37,extraout_XMM0_Ba_37)))),
                     (local_18->ItemInnerSpacing).x);
            ImVec2::ImVec2((ImVec2 *)&io,0.0,0.0);
            bVar19 = Button("Revert",(ImVec2 *)&io);
            cVar32 = extraout_XMM0_Ba_38;
            cVar34 = extraout_XMM0_Bb_38;
            cVar36 = extraout_XMM0_Bc_38;
            cVar38 = extraout_XMM0_Bd_38;
            if (bVar19) {
              pIVar29 = style->Colors + name_1._4_4_;
              pIVar24 = local_18->Colors + name_1._4_4_;
              fVar8 = pIVar29->y;
              pIVar24->x = pIVar29->x;
              pIVar24->y = fVar8;
              fVar8 = pIVar29->w;
              pIVar24->z = pIVar29->z;
              pIVar24->w = fVar8;
            }
          }
          SameLine((float)(CONCAT13(cVar38,CONCAT12(cVar36,CONCAT11(cVar34,cVar32))) ^
                          CONCAT13(cVar38,CONCAT12(cVar36,CONCAT11(cVar34,cVar32)))),
                   (local_18->ItemInnerSpacing).x);
          TextUnformatted(local_70,(char *)0x0);
          PopID();
        }
      }
      PopItemWidth();
      EndChild();
      EndTabItem();
    }
    bVar19 = BeginTabItem("Fonts",(bool *)0x0,0);
    if (bVar19) {
      pIVar25 = GetIO();
      pIVar3 = pIVar25->Fonts;
      HelpMarker("Read FAQ and misc/fonts/README.txt for details on font loading.");
      PushItemWidth(120.0);
      for (font._4_4_ = 0; font._4_4_ < (pIVar3->Fonts).Size; font._4_4_ = font._4_4_ + 1) {
        ppIVar26 = ImVector<ImFont_*>::operator[](&pIVar3->Fonts,font._4_4_);
        font_00 = *ppIVar26;
        PushID(font_00);
        if (font_00->ConfigData == (ImFontConfig *)0x0) {
          local_180 = "";
        }
        else {
          local_180 = font_00->ConfigData->Name;
        }
        bVar19 = TreeNode(font_00,"Font %d: \"%s\"\n%.2f px, %d glyphs, %d file(s)",font._4_4_,
                          local_180,(font_00->Glyphs).Size,(int)font_00->ConfigDataCount);
        SameLine((float)(CONCAT13(extraout_XMM0_Bd_39,
                                  CONCAT12(extraout_XMM0_Bc_39,
                                           CONCAT11(extraout_XMM0_Bb_39,extraout_XMM0_Ba_39))) ^
                        CONCAT13(extraout_XMM0_Bd_39,
                                 CONCAT12(extraout_XMM0_Bc_39,
                                          CONCAT11(extraout_XMM0_Bb_39,extraout_XMM0_Ba_39)))),-1.0)
        ;
        bVar20 = SmallButton("Set as default");
        if (bVar20) {
          pIVar25->FontDefault = font_00;
        }
        if (bVar19) {
          PushFont(font_00);
          Text("The quick brown fox jumps over the lazy dog");
          PopFont();
          DragFloat("Font scale",&font_00->Scale,0.005,0.3,2.0,"%.1f",1.0);
          SameLine((float)(CONCAT13(extraout_XMM0_Bd_40,
                                    CONCAT12(extraout_XMM0_Bc_40,
                                             CONCAT11(extraout_XMM0_Bb_40,extraout_XMM0_Ba_40))) ^
                          CONCAT13(extraout_XMM0_Bd_40,
                                   CONCAT12(extraout_XMM0_Bc_40,
                                            CONCAT11(extraout_XMM0_Bb_40,extraout_XMM0_Ba_40)))),
                   -1.0);
          HelpMarker(
                    "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)"
                    );
          InputFloat("Font offset",&(font_00->DisplayOffset).y,1.0,1.0,"%.0f",0);
          Text("Ascent: %f, Descent: %f, Height: %f",
               CONCAT17(extraout_XMM0_Bh_00,
                        CONCAT16(extraout_XMM0_Bg_00,
                                 CONCAT15(extraout_XMM0_Bf_00,
                                          CONCAT14(extraout_XMM0_Be_00,
                                                   CONCAT13(extraout_XMM0_Bd_40,
                                                            CONCAT12(extraout_XMM0_Bc_40,
                                                                     CONCAT11(extraout_XMM0_Bb_40,
                                                                              extraout_XMM0_Ba_40)))
                                                  )))),(double)font_00->Descent,
               (double)(font_00->Ascent - font_00->Descent));
          Text("Fallback character: \'%c\' (U+%04X)",(ulong)font_00->FallbackChar,
               (ulong)font_00->FallbackChar);
          Text("Ellipsis character: \'%c\' (U+%04X)",(ulong)font_00->EllipsisChar,
               (ulong)font_00->EllipsisChar);
          fVar8 = sqrtf((float)font_00->MetricsTotalSurface);
          Text("Texture surface: %d pixels (approx) ~ %dx%d",font_00->MetricsTotalSurface,(int)fVar8
               ,(int)fVar8);
          for (cfg._4_4_ = 0; cfg._4_4_ < font_00->ConfigDataCount; cfg._4_4_ = cfg._4_4_ + 1) {
            pIVar27 = font_00->ConfigData + cfg._4_4_;
            if (pIVar27 != (ImFontConfig *)0x0) {
              BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d",cfg._4_4_,
                         pIVar27->Name,pIVar27->OversampleH,pIVar27->OversampleV,
                         (ulong)(pIVar27->PixelSnapH & 1));
            }
          }
          bVar19 = TreeNode("Glyphs","Glyphs (%d)",(font_00->Glyphs).Size);
          if (bVar19) {
            for (n = 0; n < 0x10000; n = n + 0x100) {
              cell_size = 0.0;
              for (cell_spacing = 0.0; sVar18 = (short)n, (int)cell_spacing < 0x100;
                  cell_spacing = (float)((int)cell_spacing + 1)) {
                pIVar28 = ImFont::FindGlyphNoFallback(font_00,sVar18 + SUB42(cell_spacing,0));
                cell_size = (float)((uint)(pIVar28 != (ImFontGlyph *)0x0) + (int)cell_size);
              }
              if (0 < (int)cell_size) {
                pcVar30 = "glyph";
                if (1 < (int)cell_size) {
                  pcVar30 = "glyphs";
                }
                bVar19 = TreeNode((void *)(long)n,"U+%04X..U+%04X (%d %s)",n,(ulong)(n + 0xff),
                                  cell_size,pcVar30);
                if (bVar19) {
                  fVar8 = font_00->FontSize;
                  fVar1 = (local_18->ItemSpacing).y;
                  IVar9 = GetCursorScreenPos();
                  this = GetWindowDrawList();
                  for (cell_p1.x = 0.0; (int)cell_p1.x < 0x100;
                      cell_p1.x = (float)((int)cell_p1.x + 1)) {
                    draw_list._4_4_ = IVar9.x;
                    fStack_d0 = IVar9.y;
                    ImVec2::ImVec2(&cell_p2,(float)((int)cell_p1.x % 0x10) * (fVar8 + fVar1) +
                                            draw_list._4_4_,
                                   (float)((int)cell_p1.x / 0x10) * (fVar8 + fVar1) + fStack_d0);
                    ImVec2::ImVec2((ImVec2 *)((long)&glyph + 4),cell_p2.x + fVar8,cell_p2.y + fVar8)
                    ;
                    pIVar28 = ImFont::FindGlyphNoFallback(font_00,sVar18 + SUB42(cell_p1.x,0));
                    IVar22 = 0x32ffffff;
                    if (pIVar28 != (ImFontGlyph *)0x0) {
                      IVar22 = 0x64ffffff;
                    }
                    ImDrawList::AddRect(this,&cell_p2,(ImVec2 *)((long)&glyph + 4),IVar22,
                                        (float)(CONCAT13(extraout_XMM0_Bd_41,
                                                         CONCAT12(extraout_XMM0_Bc_41,
                                                                  CONCAT11(extraout_XMM0_Bb_41,
                                                                           extraout_XMM0_Ba_41))) ^
                                               CONCAT13(extraout_XMM0_Bd_41,
                                                        CONCAT12(extraout_XMM0_Bc_41,
                                                                 CONCAT11(extraout_XMM0_Bb_41,
                                                                          extraout_XMM0_Ba_41)))),
                                        0xf,1.0);
                    if (pIVar28 != (ImFontGlyph *)0x0) {
                      pos.y = cell_p2.y;
                      pos.x = cell_p2.x;
                      IVar22 = GetColorU32(0,1.0);
                      ImFont::RenderChar(font_00,this,fVar8,pos,IVar22,sVar18 + SUB42(cell_p1.x,0));
                      bVar19 = IsMouseHoveringRect(&cell_p2,(ImVec2 *)((long)&glyph + 4),true);
                      if (bVar19) {
                        BeginTooltip();
                        Text("Codepoint: U+%04X",(ulong)(uint)(n + (int)cell_p1.x));
                        Separator();
                        Text("AdvanceX: %.1f");
                        Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",
                             CONCAT17(extraout_XMM0_Bh_01,
                                      CONCAT16(extraout_XMM0_Bg_01,
                                               CONCAT15(extraout_XMM0_Bf_01,
                                                        CONCAT14(extraout_XMM0_Be_01,
                                                                 CONCAT13(extraout_XMM0_Bd_41,
                                                                          CONCAT12(
                                                  extraout_XMM0_Bc_41,
                                                  CONCAT11(extraout_XMM0_Bb_41,extraout_XMM0_Ba_41))
                                                  ))))),(double)pIVar28->Y0,(double)pIVar28->X1,
                             (double)pIVar28->Y1);
                        Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",
                             CONCAT17(extraout_XMM0_Bh_02,
                                      CONCAT16(extraout_XMM0_Bg_02,
                                               CONCAT15(extraout_XMM0_Bf_02,
                                                        CONCAT14(extraout_XMM0_Be_02,
                                                                 CONCAT13(extraout_XMM0_Bd_41,
                                                                          CONCAT12(
                                                  extraout_XMM0_Bc_41,
                                                  CONCAT11(extraout_XMM0_Bb_41,extraout_XMM0_Ba_41))
                                                  ))))),(double)pIVar28->V0,(double)pIVar28->U1,
                             (double)pIVar28->V1);
                        EndTooltip();
                      }
                    }
                  }
                  ImVec2::ImVec2((ImVec2 *)&tint_col.z,(fVar8 + fVar1) * 16.0,(fVar8 + fVar1) * 16.0
                                );
                  Dummy((ImVec2 *)&tint_col.z);
                  TreePop();
                }
              }
            }
            TreePop();
          }
          TreePop();
        }
        PopID();
      }
      bVar19 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",pIVar3->TexWidth,
                        pIVar3->TexHeight);
      if (bVar19) {
        ImVec4::ImVec4((ImVec4 *)&border_col.z,1.0,1.0,1.0,1.0);
        ImVec4::ImVec4((ImVec4 *)local_130,1.0,1.0,1.0,0.5);
        user_texture_id = pIVar3->TexID;
        ImVec2::ImVec2(&local_138,(float)pIVar3->TexWidth,(float)pIVar3->TexHeight);
        ImVec2::ImVec2(&local_140,0.0,0.0);
        ImVec2::ImVec2(&local_148,1.0,1.0);
        Image(user_texture_id,&local_138,&local_140,&local_148,(ImVec4 *)&border_col.z,
              (ImVec4 *)local_130);
        TreePop();
      }
      HelpMarker(
                "Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure."
                );
      bVar19 = DragFloat("window scale",&ShowStyleEditor::window_scale,0.005,0.3,2.0,"%.2f",1.0);
      if (bVar19) {
        SetWindowFontScale(ShowStyleEditor::window_scale);
      }
      DragFloat("global scale",&pIVar25->FontGlobalScale,0.005,0.3,2.0,"%.2f",1.0);
      PopItemWidth();
      EndTabItem();
    }
    bVar19 = BeginTabItem("Rendering",(bool *)0x0,0);
    if (bVar19) {
      Checkbox("Anti-aliased lines",&local_18->AntiAliasedLines);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_42,
                                CONCAT12(extraout_XMM0_Bc_42,
                                         CONCAT11(extraout_XMM0_Bb_42,extraout_XMM0_Ba_42))) ^
                      CONCAT13(extraout_XMM0_Bd_42,
                               CONCAT12(extraout_XMM0_Bc_42,
                                        CONCAT11(extraout_XMM0_Bb_42,extraout_XMM0_Ba_42)))),-1.0);
      HelpMarker(
                "When disabling anti-aliasing lines, you\'ll probably want to disable borders in your style as well."
                );
      Checkbox("Anti-aliased fill",&local_18->AntiAliasedFill);
      PushItemWidth(100.0);
      DragFloat("Curve Tessellation Tolerance",&local_18->CurveTessellationTol,0.02,0.1,
                3.4028235e+38,"%.2f",2.0);
      if (local_18->CurveTessellationTol <= 0.1 && local_18->CurveTessellationTol != 0.1) {
        local_18->CurveTessellationTol = 0.1;
      }
      DragFloat("Global Alpha",&local_18->Alpha,0.005,0.2,1.0,"%.2f",1.0);
      PopItemWidth();
      EndTabItem();
    }
    EndTabBar();
  }
  PopItemWidth();
  return;
}

Assistant:

void ImGui::ShowStyleEditor(ImGuiStyle* ref)
{
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to (else it compares to an internally stored reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f"))
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool window_border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &window_border)) style.WindowBorderSize = window_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool frame_border = (style.FrameBorderSize > 0.0f); if (ImGui::Checkbox("FrameBorder", &frame_border)) style.FrameBorderSize = frame_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool popup_border = (style.PopupBorderSize > 0.0f); if (ImGui::Checkbox("PopupBorder", &popup_border)) style.PopupBorderSize = popup_border ? 1.0f : 0.0f; }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    HelpMarker("Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere.");

    ImGui::Separator();

    if (ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None))
    {
        if (ImGui::BeginTabItem("Sizes"))
        {
            ImGui::Text("Main");
            ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
            ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
            ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
            ImGui::Text("Borders");
            ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("TabBorderSize", &style.TabBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::Text("Rounding");
            ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("TabRounding", &style.TabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::Text("Alignment");
            ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
            int window_menu_button_position = style.WindowMenuButtonPosition + 1;
            if (ImGui::Combo("WindowMenuButtonPosition", (int*)&window_menu_button_position, "None\0Left\0Right\0"))
                style.WindowMenuButtonPosition = window_menu_button_position - 1;
            ImGui::Combo("ColorButtonPosition", (int*)&style.ColorButtonPosition, "Left\0Right\0");
            ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Alignment applies when a button is larger than its text content.");
            ImGui::SliderFloat2("SelectableTextAlign", (float*)&style.SelectableTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Alignment applies when a selectable is larger than its text content.");
            ImGui::Text("Safe Area Padding"); ImGui::SameLine(); HelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
            ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Colors"))
        {
            static int output_dest = 0;
            static bool output_only_modified = true;
            if (ImGui::Button("Export"))
            {
                if (output_dest == 0)
                    ImGui::LogToClipboard();
                else
                    ImGui::LogToTTY();
                ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
                for (int i = 0; i < ImGuiCol_COUNT; i++)
                {
                    const ImVec4& col = style.Colors[i];
                    const char* name = ImGui::GetStyleColorName(i);
                    if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                        ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE, name, 23 - (int)strlen(name), "", col.x, col.y, col.z, col.w);
                }
                ImGui::LogFinish();
            }
            ImGui::SameLine(); ImGui::SetNextItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0");
            ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

            static ImGuiTextFilter filter;
            filter.Draw("Filter colors", ImGui::GetFontSize() * 16);

            static ImGuiColorEditFlags alpha_flags = 0;
            ImGui::RadioButton("Opaque", &alpha_flags, 0); ImGui::SameLine();
            ImGui::RadioButton("Alpha", &alpha_flags, ImGuiColorEditFlags_AlphaPreview); ImGui::SameLine();
            ImGui::RadioButton("Both", &alpha_flags, ImGuiColorEditFlags_AlphaPreviewHalf); ImGui::SameLine();
            HelpMarker("In the color list:\nLeft-click on colored square to open color picker,\nRight-click to open edit options menu.");

            ImGui::BeginChild("##colors", ImVec2(0, 0), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
            ImGui::PushItemWidth(-160);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const char* name = ImGui::GetStyleColorName(i);
                if (!filter.PassFilter(name))
                    continue;
                ImGui::PushID(i);
                ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
                if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
                {
                    // Tips: in a real user application, you may want to merge and use an icon font into the main font, so instead of "Save"/"Revert" you'd use icons.
                    // Read the FAQ and misc/fonts/README.txt about using icon fonts. It's really easy and super convenient!
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) ref->Colors[i] = style.Colors[i];
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) style.Colors[i] = ref->Colors[i];
                }
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
                ImGui::TextUnformatted(name);
                ImGui::PopID();
            }
            ImGui::PopItemWidth();
            ImGui::EndChild();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Fonts"))
        {
            ImGuiIO& io = ImGui::GetIO();
            ImFontAtlas* atlas = io.Fonts;
            HelpMarker("Read FAQ and misc/fonts/README.txt for details on font loading.");
            ImGui::PushItemWidth(120);
            for (int i = 0; i < atlas->Fonts.Size; i++)
            {
                ImFont* font = atlas->Fonts[i];
                ImGui::PushID(font);
                bool font_details_opened = ImGui::TreeNode(font, "Font %d: \"%s\"\n%.2f px, %d glyphs, %d file(s)", i, font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size, font->ConfigDataCount);
                ImGui::SameLine(); if (ImGui::SmallButton("Set as default")) { io.FontDefault = font; }
                if (font_details_opened)
                {
                    ImGui::PushFont(font);
                    ImGui::Text("The quick brown fox jumps over the lazy dog");
                    ImGui::PopFont();
                    ImGui::DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");   // Scale only this font
                    ImGui::SameLine(); HelpMarker("Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)");
                    ImGui::InputFloat("Font offset", &font->DisplayOffset.y, 1, 1, "%.0f");
                    ImGui::Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
                    ImGui::Text("Fallback character: '%c' (U+%04X)", font->FallbackChar, font->FallbackChar);
                    ImGui::Text("Ellipsis character: '%c' (U+%04X)", font->EllipsisChar, font->EllipsisChar);
                    const float surface_sqrt = sqrtf((float)font->MetricsTotalSurface);
                    ImGui::Text("Texture surface: %d pixels (approx) ~ %dx%d", font->MetricsTotalSurface, (int)surface_sqrt, (int)surface_sqrt);
                    for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
                        if (const ImFontConfig* cfg = &font->ConfigData[config_i])
                            ImGui::BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d", config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH);
                    if (ImGui::TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
                    {
                        // Display all glyphs of the fonts in separate pages of 256 characters
                        for (int base = 0; base < 0x10000; base += 256)
                        {
                            int count = 0;
                            for (int n = 0; n < 256; n++)
                                count += font->FindGlyphNoFallback((ImWchar)(base + n)) ? 1 : 0;
                            if (count > 0 && ImGui::TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base + 255, count, count > 1 ? "glyphs" : "glyph"))
                            {
                                float cell_size = font->FontSize * 1;
                                float cell_spacing = style.ItemSpacing.y;
                                ImVec2 base_pos = ImGui::GetCursorScreenPos();
                                ImDrawList* draw_list = ImGui::GetWindowDrawList();
                                for (int n = 0; n < 256; n++)
                                {
                                    ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                                    ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                                    const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base + n));
                                    draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255, 255, 255, 100) : IM_COL32(255, 255, 255, 50));
                                    if (glyph)
                                        font->RenderChar(draw_list, cell_size, cell_p1, ImGui::GetColorU32(ImGuiCol_Text), (ImWchar)(base + n)); // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions available to generate a string.
                                    if (glyph && ImGui::IsMouseHoveringRect(cell_p1, cell_p2))
                                    {
                                        ImGui::BeginTooltip();
                                        ImGui::Text("Codepoint: U+%04X", base + n);
                                        ImGui::Separator();
                                        ImGui::Text("AdvanceX: %.1f", glyph->AdvanceX);
                                        ImGui::Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                                        ImGui::Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                                        ImGui::EndTooltip();
                                    }
                                }
                                ImGui::Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
                                ImGui::TreePop();
                            }
                        }
                        ImGui::TreePop();
                    }
                    ImGui::TreePop();
                }
                ImGui::PopID();
            }
            if (ImGui::TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
            {
                ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
                ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
                ImGui::Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0, 0), ImVec2(1, 1), tint_col, border_col);
                ImGui::TreePop();
            }

            HelpMarker("Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.");
            static float window_scale = 1.0f;
            if (ImGui::DragFloat("window scale", &window_scale, 0.005f, 0.3f, 2.0f, "%.2f"))   // scale only this window
                ImGui::SetWindowFontScale(window_scale);
            ImGui::DragFloat("global scale", &io.FontGlobalScale, 0.005f, 0.3f, 2.0f, "%.2f");      // scale everything
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Rendering"))
        {
            ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines); ImGui::SameLine(); HelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");
            ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
            ImGui::PushItemWidth(100);
            ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, FLT_MAX, "%.2f", 2.0f);
            if (style.CurveTessellationTol < 0.10f) style.CurveTessellationTol = 0.10f;
            ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::PopItemWidth();
}